

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimalbackingstore.cpp
# Opt level: O2

void __thiscall
QMinimalBackingStore::QMinimalBackingStore(QMinimalBackingStore *this,QWindow *window)

{
  uint uVar1;
  QMinimalIntegration *pQVar2;
  QDebug *this_00;
  long in_FS_OFFSET;
  QDebug local_20 [8];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QPlatformBackingStore::QPlatformBackingStore(&this->super_QPlatformBackingStore,window);
  *(undefined ***)this = &PTR__QMinimalBackingStore_001087f0;
  QImage::QImage(&this->mImage);
  pQVar2 = QMinimalIntegration::instance();
  uVar1 = pQVar2->m_options & 1;
  this->mDebug = SUB41(uVar1,0);
  if (uVar1 != 0) {
    QMessageLogger::debug();
    this_00 = QDebug::operator<<(local_20,"QMinimalBackingStore::QMinimalBackingStore:");
    QDebug::operator<<(this_00,(quint64)this);
    QDebug::~QDebug(local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMinimalBackingStore::QMinimalBackingStore(QWindow *window)
    : QPlatformBackingStore(window)
    , mDebug(QMinimalIntegration::instance()->options() & QMinimalIntegration::DebugBackingStore)
{
    if (mDebug)
        qDebug() << "QMinimalBackingStore::QMinimalBackingStore:" << (quintptr)this;
}